

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O0

int left_of_aliens_proc(Am_Object *param_1)

{
  byte bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object local_30;
  Am_Object this_alien;
  Am_Value_List aliens;
  Am_Object *param_0_local;
  
  pAVar3 = (Am_Value *)Am_Object::Get(0xb2e8,0x82);
  Am_Value_List::Am_Value_List((Am_Value_List *)&this_alien,pAVar3);
  Am_Object::Am_Object(&local_30);
  Am_Value_List::Start();
  do {
    bVar1 = Am_Value_List::Last();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      param_0_local._4_4_ = 0;
LAB_001055df:
      Am_Object::~Am_Object(&local_30);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&this_alien);
      return param_0_local._4_4_;
    }
    pAVar3 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_30,pAVar3);
    Am_Object::Get((ushort)&local_30,0xb0);
    bVar1 = Am_Value::Valid();
    if ((bVar1 & 1) != 0) {
      pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_30,100);
      iVar2 = Am_Value::operator_cast_to_int(pAVar3);
      param_0_local._4_4_ = 10 - iVar2;
      goto LAB_001055df;
    }
    Am_Value_List::Next();
  } while( true );
}

Assistant:

Am_Define_No_Self_Formula(int, left_of_aliens)
{
  Am_Value_List aliens = Aliens.Get(Am_GRAPHICAL_PARTS);
  Am_Object this_alien;
  for (aliens.Start(); !aliens.Last(); aliens.Next()) {
    this_alien = aliens.Get();
    if (this_alien.Get(Am_IMAGE).Valid())
      return 10 - (int)this_alien.Get(Am_LEFT);
  }
  return 0;
}